

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O2

ssize_t __thiscall bsplib::A2A::send(A2A *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  pointer puVar7;
  ulong uVar8;
  pointer pcVar9;
  char *__assertion;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (__fd < 0) {
    __assertion = "dst_pid >= 0";
    uVar1 = 0x47;
  }
  else {
    uVar1 = this->m_nprocs;
    if (__fd < (int)uVar1) {
      uVar10 = this->m_send_cap;
      pcVar9 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar10 == (ulong)((long)(this->m_send_bufs).
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pcVar9) / (ulong)uVar1)
      {
        uVar11 = (ulong)(uint)__fd;
        puVar7 = (this->m_send_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = puVar7[uVar11];
        uVar5 = uVar2 + __n;
        if (uVar10 < uVar5) {
          uVar12 = uVar10 * 2;
          if (uVar10 * 2 <= uVar5) {
            uVar12 = uVar5;
          }
          std::vector<char,_std::allocator<char>_>::resize(&this->m_send_bufs,uVar1 * uVar12);
          uVar10 = (ulong)(uint)this->m_nprocs;
          uVar5 = uVar10;
          while (uVar10 = uVar10 - 1, 0 < (int)uVar5) {
            sVar3 = this->m_send_cap;
            uVar4 = uVar5 - 1;
            for (uVar8 = uVar12 * uVar5; uVar5 = uVar4, uVar12 * uVar4 < uVar8; uVar8 = uVar8 - 1) {
              pcVar9 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pcVar9[uVar8 - 1] = pcVar9[(sVar3 - uVar12) * uVar10 + (uVar8 - 1)];
            }
          }
          this->m_send_cap = uVar12;
          puVar7 = (this->m_send_sizes).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar9 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = puVar7[uVar11] + __n;
        }
        puVar7[uVar11] = uVar5;
        pvVar6 = memcpy(pcVar9 + uVar11 * this->m_send_cap + uVar2,__buf,__n);
        return (ssize_t)pvVar6;
      }
      __assertion = "m_send_cap == m_send_bufs.size() / m_nprocs";
      uVar1 = 0x4a;
    }
    else {
      __assertion = "dst_pid < m_nprocs";
      uVar1 = 0x48;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                ,uVar1,"void *bsplib::A2A::send(int, const void *, std::size_t)");
}

Assistant:

void * A2A::send( int dst_pid, const void * data, std::size_t size )
{
    assert( dst_pid >= 0 );
    assert( dst_pid < m_nprocs );

    assert( m_send_cap == m_send_bufs.size() / m_nprocs );

    std::size_t offset = m_send_sizes[ dst_pid ];
    if ( m_send_cap < offset + size ) {
        std::size_t new_cap =
           std::max( 2 * m_send_cap , offset + size );

        m_send_bufs.resize( m_nprocs * new_cap );
        for ( int p = m_nprocs; p > 0; --p ) {
            std::size_t displ = new_cap - m_send_cap;

            for ( size_t i = p*new_cap; i > (p-1)*new_cap; --i) {
                m_send_bufs[i-1] = m_send_bufs[i-displ*(p-1)-1];
            }
        }  
        m_send_cap = new_cap;
    }
    m_send_sizes[ dst_pid ] += size;
    void * send_buf = m_send_bufs.data() + dst_pid * m_send_cap + offset;
    std::memcpy( send_buf , data, size );
    return send_buf;
}